

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_b4885::____C_A_T_C_H____T_E_S_T____24::test(____C_A_T_C_H____T_E_S_T____24 *this)

{
  int iVar1;
  Family id;
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var2;
  undefined4 extraout_var;
  pointer pEVar3;
  IResultCapture *pIVar4;
  socklen_t __len;
  EntityDestroyedEventReceiver *pEVar5;
  sockaddr *__addr;
  _Any_data *p_Var6;
  bool bVar7;
  EventCallbackWrapper<entityx::EntityDestroyedEvent> wrapper;
  AssertionReaction local_130;
  bool local_12e;
  IResultCapture *local_128;
  EventSignalPtr sig;
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> entities;
  undefined1 local_e8 [9];
  undefined7 uStack_df;
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> *local_d8;
  _Invoker_type p_Stack_d0;
  undefined8 local_c8;
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> *local_c0;
  long local_b8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  undefined8 local_a8;
  EntityDestroyedEventReceiver receiver;
  undefined8 local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  receiver.super_Receiver<EntityDestroyedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_buckets = &receiver.super_Receiver<EntityDestroyedEventReceiver>.super_BaseReceiver.
                connections_._M_h._M_single_bucket;
  receiver.super_Receiver<EntityDestroyedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_bucket_count = 1;
  receiver.super_Receiver<EntityDestroyedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  receiver.super_Receiver<EntityDestroyedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_element_count = 0;
  receiver.super_Receiver<EntityDestroyedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_rehash_policy._M_max_load_factor = 1.0;
  receiver.super_Receiver<EntityDestroyedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_rehash_policy._M_next_resize = 0;
  receiver.super_Receiver<EntityDestroyedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  receiver.super_Receiver<EntityDestroyedEventReceiver>.super_BaseReceiver._vptr_BaseReceiver =
       (_func_int **)&PTR__EntityDestroyedEventReceiver_0020b4e0;
  receiver.destroyed.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  receiver.destroyed.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  receiver.destroyed.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  id = entityx::Event<entityx::EntityDestroyedEvent>::family();
  p_Var2 = &entityx::EventManager::signal_for((EventManager *)this,id)->
            super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
  Catch::clara::std::
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&sig.
                  super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                 ,p_Var2);
  local_e8._0_8_ = (void *)0x0;
  stack0xffffffffffffff20 = 0;
  local_d8 = (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)0x0;
  p_Stack_d0 = (_Invoker_type)0x0;
  local_e8._0_8_ = operator_new(0x18);
  *(code **)local_e8._0_8_ =
       (anonymous_namespace)::____C_A_T_C_H____T_E_S_T____24::test()::EntityDestroyedEventReceiver::
       receive(entityx::EntityDestroyedEvent_const__;
  *(undefined8 *)(local_e8._0_8_ + 8) = 0;
  pEVar5 = &receiver;
  *(EntityDestroyedEventReceiver **)(local_e8._0_8_ + 0x10) = pEVar5;
  p_Stack_d0 = Catch::clara::std::
               _Function_handler<void_(const_entityx::EntityDestroyedEvent_&),_std::_Bind<void_(EntityDestroyedEventReceiver::*(EntityDestroyedEventReceiver_*,_std::_Placeholder<1>))(const_entityx::EntityDestroyedEvent_&)>_>
               ::_M_invoke;
  local_d8 = (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)
             Catch::clara::std::
             _Function_handler<void_(const_entityx::EntityDestroyedEvent_&),_std::_Bind<void_(EntityDestroyedEventReceiver::*(EntityDestroyedEventReceiver_*,_std::_Placeholder<1>))(const_entityx::EntityDestroyedEvent_&)>_>
             ::_M_manager;
  Catch::clara::std::function<void_(const_entityx::EntityDestroyedEvent_&)>::function
            (&wrapper.callback,(function<void_(const_entityx::EntityDestroyedEvent_&)> *)local_e8);
  __len = (socklen_t)pEVar5;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)local_e8);
  std::function<void(void_const*)>::
  function<entityx::EventManager::EventCallbackWrapper<entityx::EntityDestroyedEvent>&,void>
            ((function<void(void_const*)> *)&entities,&wrapper);
  iVar1 = Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
          connect(&(sig.
                    super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->
                   super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,
                  (int)&entities,__addr,__len);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&entities);
  pEVar3 = (pointer)entityx::Event<entityx::EntityDestroyedEvent>::family();
  std::
  __weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,(__gnu_cxx::_Lock_policy)2>
  ::__weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,void>
            ((__weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_48,
             &sig.
              super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
            );
  local_48 = 0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8 = 0;
  _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  entities.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_start = pEVar3;
  local_a8 = CONCAT44(extraout_var,iVar1);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<unsigned_long,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&receiver.super_Receiver<EntityDestroyedEventReceiver>.super_BaseReceiver.
                 connections_,&entities);
  Catch::clara::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
             &entities.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  Catch::clara::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_b0);
  Catch::clara::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(a_Stack_40);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&wrapper);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sig.
              super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  wrapper.callback.super__Function_base._M_functor._8_8_ = 7;
  wrapper.callback.super__Function_base._M_functor._M_unused._M_function_pointer =
       (_func_void *)"REQUIRE";
  wrapper.callback.super__Function_base._M_manager = (_Manager_type)anon_var_dwarf_b4855;
  wrapper.callback._M_invoker = (_Invoker_type)0x149;
  local_130.shouldDebugBreak = false;
  local_130.shouldThrow = false;
  local_12e = false;
  local_128 = Catch::getResultCapture();
  entities.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uStack_df._0_1_ =
       (long)receiver.destroyed.
             super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)receiver.destroyed.
             super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_start == 0;
  local_b8 = (long)receiver.destroyed.
                   super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)receiver.destroyed.
                   super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4;
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_0020d6c8;
  p_Stack_d0 = (_Invoker_type)0x1d838b;
  local_c8 = 2;
  local_d8 = &entities;
  local_c0 = (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)&local_b8;
  (*local_128->_vptr_IResultCapture[10])(local_128,&wrapper);
  Catch::AssertionHandler::complete((AssertionHandler *)&wrapper);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&wrapper);
  entities.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entities.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  entities.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = 10;
  while (bVar7 = iVar1 != 0, iVar1 = iVar1 + -1, bVar7) {
    wrapper.callback.super__Function_base._M_functor =
         (_Any_data)entityx::EntityManager::create(&(this->super_EntityManagerFixture).em);
    Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::
    emplace_back<entityx::Entity>(&entities,(Entity *)&wrapper);
  }
  wrapper.callback.super__Function_base._M_functor._8_8_ = 7;
  wrapper.callback.super__Function_base._M_functor._M_unused._M_function_pointer =
       (_func_void *)"REQUIRE";
  wrapper.callback.super__Function_base._M_manager = (_Manager_type)anon_var_dwarf_b4855;
  wrapper.callback._M_invoker = (_Invoker_type)0x14e;
  local_130.shouldDebugBreak = false;
  local_130.shouldThrow = false;
  local_12e = false;
  local_128 = Catch::getResultCapture();
  local_b8 = 0;
  uStack_df._0_1_ =
       (long)receiver.destroyed.
             super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)receiver.destroyed.
             super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_start == 0;
  sig.
  super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            ((long)receiver.destroyed.
                   super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)receiver.destroyed.
                   super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_0020d6c8;
  p_Stack_d0 = (_Invoker_type)0x1d838b;
  local_c8 = 2;
  local_d8 = (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)&local_b8;
  local_c0 = (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)&sig;
  (*local_128->_vptr_IResultCapture[10])(local_128,&wrapper);
  Catch::AssertionHandler::complete((AssertionHandler *)&wrapper);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&wrapper);
  pEVar3 = entities.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (p_Var6 = (_Any_data *)
                entities.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
                _M_impl.super__Vector_impl_data._M_start; p_Var6 != (_Any_data *)pEVar3;
      p_Var6 = p_Var6 + 1) {
    wrapper.callback.super__Function_base._M_functor = *p_Var6;
    entityx::Entity::destroy();
  }
  wrapper.callback.super__Function_base._M_functor._8_8_ = 7;
  wrapper.callback.super__Function_base._M_functor._M_unused._M_function_pointer =
       (_func_void *)"REQUIRE";
  wrapper.callback.super__Function_base._M_manager = (_Manager_type)anon_var_dwarf_b4855;
  wrapper.callback._M_invoker = (_Invoker_type)0x152;
  local_130.shouldDebugBreak = false;
  local_130.shouldThrow = false;
  local_12e = false;
  local_128 = Catch::getResultCapture();
  sig.
  super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            ((long)receiver.destroyed.
                   super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)receiver.destroyed.
                   super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  uStack_df._0_1_ =
       (long)receiver.destroyed.
             super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)receiver.destroyed.
             super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_start == 0xa0;
  local_e8[8] = 1;
  local_b8 = 10;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_0020d6c8;
  p_Stack_d0 = (_Invoker_type)0x1d838b;
  local_c8 = 2;
  local_d8 = (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)&local_b8;
  local_c0 = (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)&sig;
  (*local_128->_vptr_IResultCapture[10])(local_128,&wrapper);
  Catch::AssertionHandler::complete((AssertionHandler *)&wrapper);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&wrapper);
  wrapper.callback.super__Function_base._M_functor._8_8_ = 7;
  wrapper.callback.super__Function_base._M_functor._M_unused._M_function_pointer =
       (_func_void *)"REQUIRE";
  wrapper.callback.super__Function_base._M_manager = (_Manager_type)anon_var_dwarf_b4855;
  wrapper.callback._M_invoker = (_Invoker_type)0x153;
  local_130.shouldDebugBreak = false;
  local_130.shouldThrow = false;
  local_12e = false;
  pIVar4 = Catch::getResultCapture();
  local_128 = pIVar4;
  uStack_df._0_1_ = std::operator==(&entities,&receiver.destroyed);
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_0020dd70;
  p_Stack_d0 = (_Invoker_type)0x1d838b;
  local_c8 = 2;
  local_d8 = &entities;
  local_c0 = &receiver.destroyed;
  (*pIVar4->_vptr_IResultCapture[10])(pIVar4,&wrapper,local_e8,&local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)&wrapper);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&wrapper);
  Catch::clara::std::_Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>::~_Vector_base
            (&entities.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>);
  test::EntityDestroyedEventReceiver::~EntityDestroyedEventReceiver(&receiver);
  return;
}

Assistant:

void receive(const EntityDestroyedEvent &event) {
      destroyed.push_back(event.entity);
    }